

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

void __thiscall CVmObjDate::format_string_buf(CVmObjDate *this,char *buf,size_t buflen)

{
  int32_t *piVar1;
  CVmTimeZone *this_00;
  char *tzabbr;
  int32_t tzofs;
  int32_t daytime;
  int32_t dayno;
  CVmDateLocale lc;
  undefined1 local_50 [16];
  int local_40;
  caldate_t local_3c;
  
  this_00 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
  piVar1 = (int32_t *)(this->super_CVmObject).ext_;
  dayno = *piVar1;
  daytime = piVar1[1];
  tzabbr = CVmTimeZone::utc_to_local(this_00,&dayno,&daytime,&tzofs);
  local_50._0_8_ = &PTR__multicaldate_t_00364828;
  local_3c.y = 0;
  local_3c.m = 3;
  local_3c.d = 1;
  caldate_t::set_dayno(&local_3c,dayno);
  local_40 = local_3c.d;
  local_50._8_4_ = local_3c.y;
  local_50._12_4_ = local_3c.m;
  CVmDateLocale::CVmDateLocale(&lc);
  format_date(this,buf,buflen,"%Y-%m-%d %H:%M:%S",0x11,&lc,(multicaldate_t *)local_50,dayno,daytime,
              tzabbr,tzofs);
  return;
}

Assistant:

void CVmObjDate::format_string_buf(VMG_ char *buf, size_t buflen) const
{
    /* get the day number and time of day in local time */
    int32_t dayno, daytime, tzofs;
    const char *tzabbr = get_local_time(
        dayno, daytime, tzofs, G_tzcache->get_local_zone(vmg0_));

    /* convert the day number to a calendar date */
    gregcaldate_t date(dayno);

    /* format using a default template */
    CVmDateLocale lc Pvmg0_P;
    format_date(vmg_ buf, buflen, "%Y-%m-%d %H:%M:%S", 17, &lc,
                &date, dayno, daytime, tzabbr, tzofs);
}